

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::detail::version_parser::parse_number<long>(version_parser *this,long *out)

{
  bool bVar1;
  byte *pbVar2;
  undefined8 extraout_RDX;
  char *ptr;
  char *ptr_00;
  from_chars_result fVar3;
  unsigned_long local_48;
  uint64_t result;
  token *ptStack_38;
  uchar first_digit;
  token token;
  long *out_local;
  version_parser *this_local;
  errc local_10;
  
  token.lexeme = (char *)out;
  ptStack_38 = token_stream::advance((token *)this->stream,(token_stream *)out);
  token._0_8_ = extraout_RDX;
  bVar1 = is_digit(this,(token *)&stack0xffffffffffffffc8);
  if (bVar1) {
    pbVar2 = std::
             get<unsigned_char,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         *)((long)register0x00000020 + -0x37));
    local_48 = (unsigned_long)*pbVar2;
    if (*pbVar2 == 0) {
      *(unsigned_long *)token.lexeme = local_48;
      token_stream::peek((token *)this->stream,(token_stream *)0x0,local_48);
      fVar3 = success(ptr);
      this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
      local_10 = fVar3.super_from_chars_result.ec;
    }
    else {
      while (bVar1 = token_stream::advanceIfMatch
                               (this->stream,(token *)&stack0xffffffffffffffc8,digit), bVar1) {
        pbVar2 = std::
                 get<unsigned_char,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                             *)((long)register0x00000020 + -0x37));
        local_48 = local_48 * 10 + (ulong)*pbVar2;
      }
      bVar1 = number_in_range<long,unsigned_long>(local_48);
      if (bVar1) {
        *(unsigned_long *)token.lexeme = local_48;
        token_stream::peek((token *)this->stream,(token_stream *)0x0,local_48);
        fVar3 = success(ptr_00);
        this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
        local_10 = fVar3.super_from_chars_result.ec;
      }
      else {
        fVar3 = failure((char *)token._0_8_,result_out_of_range);
        this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
        local_10 = fVar3.super_from_chars_result.ec;
      }
    }
  }
  else {
    fVar3 = failure((char *)token._0_8_,invalid_argument);
    this_local = (version_parser *)fVar3.super_from_chars_result.ptr;
    local_10 = fVar3.super_from_chars_result.ec;
  }
  fVar3.super_from_chars_result.ec = local_10;
  fVar3.super_from_chars_result.ptr = (char *)this_local;
  fVar3.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar3.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse_number(Int& out) {
    token token = stream.advance();

    if (!is_digit(token)) {
      return failure(token.lexeme);
    }

    const auto first_digit = std::get<std::uint8_t>(token.value);
    std::uint64_t result = first_digit;

    if (first_digit == 0) {
      out = static_cast<Int>(result);
      return success(stream.peek().lexeme);
    }

    while (stream.advanceIfMatch(token, token_type::digit)) {
      result = result * 10 + std::get<std::uint8_t>(token.value);
    }

    if (detail::number_in_range<Int>(result)) {
      out = static_cast<Int>(result);
      return success(stream.peek().lexeme);
    }

    return failure(token.lexeme, std::errc::result_out_of_range);
  }